

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

bool __thiscall rcg::System::isCharEncodingASCII(System *this)

{
  element_type *peVar1;
  long in_RDI;
  GC_ERROR err;
  size_t size;
  int32_t v;
  INFO_DATATYPE type;
  bool ret;
  lock_guard<std::recursive_mutex> lock;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_2c;
  size_t local_28;
  int local_1c;
  int local_18;
  byte local_11;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  local_11 = 1;
  local_28 = 4;
  if (*(long *)(in_RDI + 0x70) == 0) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10d96f);
    local_2c = (*peVar1->GCGetInfo)(8,&local_18,&local_1c,&local_28);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10d911);
    local_2c = (*peVar1->TLGetInfo)(*(TL_HANDLE *)(in_RDI + 0x70),8,&local_18,&local_1c,&local_28);
  }
  if (((local_2c == 0) && (local_18 == 5)) && (local_1c != 0)) {
    local_11 = 0;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x10d9c2);
  return (bool)(local_11 & 1);
}

Assistant:

bool System::isCharEncodingASCII()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  bool ret=true;

  GenTL::INFO_DATATYPE type;
  int32_t v;
  size_t size=sizeof(v);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (tl != 0)
  {
    err=gentl->TLGetInfo(tl, GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }
  else
  {
    err=gentl->GCGetInfo(GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_INT32 &&
      v != GenTL::TL_CHAR_ENCODING_ASCII)
  {
    ret=false;
  }

  return ret;
}